

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O1

int __thiscall UdpLayer::openSocket(UdpLayer *this)

{
  bdMutex *__mutex;
  ulong uVar1;
  int iVar2;
  bdStackMutex stack;
  sockaddr_in tmpaddr;
  sockaddr local_28;
  
  __mutex = &this->sockMtx;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  iVar2 = bdnet_socket(2,2,0);
  this->sockfd = iVar2;
  uVar1._0_2_ = (this->laddr).sin_family;
  uVar1._2_2_ = (this->laddr).sin_port;
  uVar1._4_4_ = (this->laddr).sin_addr;
  local_28.sa_data._6_8_ = *(undefined8 *)(this->laddr).sin_zero;
  local_28._0_8_ = uVar1 & 0xffffffff;
  iVar2 = bdnet_bind(iVar2,&local_28,0x10);
  if (iVar2 == 0) {
    bdnet_fcntl(this->sockfd,4,0x800);
    this->errorState = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    setTTL(this,0x40);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    this->readBytes = 0;
    this->writeBytes = 0;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    this->stopThread = false;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    (*(this->super_bdThread)._vptr_bdThread[2])(this);
    iVar2 = 1;
  }
  else {
    this->errorState = 0x62;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int UdpLayer::openSocket() {
	sockMtx.lock();   /********** LOCK MUTEX *********/

	/* make a socket */
    sockfd = bdnet_socket(PF_INET, SOCK_DGRAM, 0);
#ifdef DEBUG_UDP_LAYER
	std::cerr << "UpdStreamer::openSocket()" << std::endl;
#endif
	/* bind to address */


#ifdef UDP_LOOPBACK_TESTING
        bdnet_inet_aton("127.0.0.1", &(laddr.sin_addr));
#endif

#ifdef OPEN_UNIVERSAL_PORT
    struct sockaddr_in tmpaddr = laddr;
    tmpaddr.sin_addr.s_addr = 0;
	if (0 != bdnet_bind(sockfd, (struct sockaddr *) (&tmpaddr), sizeof(tmpaddr)))
#else
	if (0 != bdnet_bind(sockfd, (struct sockaddr *) (&laddr), sizeof(laddr)))
#endif
	{
#ifdef DEBUG_UDP_LAYER
		std::cerr << "Socket Failed to Bind to : " << laddr << std::endl;
		std::cerr << "Error: " << bdnet_errno() << std::endl;
#endif
		errorState = EADDRINUSE;
		//exit(1);

		sockMtx.unlock(); /******** UNLOCK MUTEX *********/
		return -1;
	}

	if (-1 == bdnet_fcntl(sockfd, F_SETFL, O_NONBLOCK)) {
#ifdef DEBUG_UDP_LAYER
		std::cerr << "Failed to Make Non-Blocking" << std::endl;
#endif
	}

#ifdef UDP_ENABLE_BROADCAST
	/* Setup socket for broadcast. */
	int val = 1;
	if (-1 == setsockopt(sockfd, SOL_SOCKET, SO_BROADCAST, &val, sizeof(int))) {
#ifdef DEBUG_UDP_LAYER
		std::cerr << "Failed to Make Socket Broadcast" << std::endl;
#endif
	}
#endif

	errorState = 0;

#ifdef DEBUG_UDP_LAYER
	std::cerr << "Socket Bound to : " << laddr << std::endl;
#endif

	sockMtx.unlock(); /******** UNLOCK MUTEX *********/

#ifdef DEBUG_UDP_LAYER
	std::cerr << "Setting TTL to " << UDP_DEF_TTL << std::endl;
#endif
	setTTL(UDP_DEF_TTL);
	clearDataTransferred(); // clear statistics.

	// start up our thread.
	{
		bdStackMutex stack(sockMtx);   /********** LOCK MUTEX *********/
		stopThread = false;
	}
	start();

	return 1;
}